

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O3

uint64_t pack_mode1_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint8_t *pSelectors)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  color_quad_u8 *pcVar6;
  bool bVar7;
  uint64_t uVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint32_t i;
  long lVar19;
  byte local_4c [28];
  
  lVar15 = 0;
  uVar12 = 0xffffffff;
  lVar1 = (ulong)r * 8;
  lVar2 = (ulong)g * 8;
  lVar3 = (ulong)b * 8;
  lVar19 = 0;
  bVar7 = true;
  do {
    bVar11 = bVar7;
    uVar16 = (uint)g_bc7_mode_1_optimal_endpoints[b][lVar15].m_error +
             (uint)g_bc7_mode_1_optimal_endpoints[g][lVar15].m_error +
             (uint)g_bc7_mode_1_optimal_endpoints[r][lVar15].m_error;
    if ((uVar16 < uVar12) && (uVar9 = (uint)lVar15, lVar19 = lVar15, uVar12 = uVar16, uVar16 == 0))
    break;
    uVar9 = (uint)lVar19;
    lVar15 = 1;
    bVar7 = false;
  } while (bVar11);
  uVar17 = (ulong)uVar9;
  uVar4 = *(uint8_t *)(lVar2 + 0x169182 + uVar17 * 4);
  uVar5 = *(uint8_t *)(lVar3 + 0x169182 + uVar17 * 4);
  (pResults->m_low_endpoint).m_c[0] = *(uint8_t *)(lVar1 + 0x169182 + uVar17 * 4);
  (pResults->m_low_endpoint).m_c[1] = uVar4;
  (pResults->m_low_endpoint).m_c[2] = uVar5;
  lVar19 = 0;
  (pResults->m_low_endpoint).m_c[3] = '\0';
  uVar4 = *(uint8_t *)(lVar2 + 0x169183 + uVar17 * 4);
  uVar5 = *(uint8_t *)(lVar3 + 0x169183 + uVar17 * 4);
  (pResults->m_high_endpoint).m_c[0] = *(uint8_t *)(lVar1 + 0x169183 + uVar17 * 4);
  (pResults->m_high_endpoint).m_c[1] = uVar4;
  (pResults->m_high_endpoint).m_c[2] = uVar5;
  (pResults->m_high_endpoint).m_c[3] = '\0';
  pResults->m_pbits[0] = uVar9;
  pResults->m_pbits[1] = 0;
  memset(pSelectors,2,(ulong)pParams->m_num_pixels);
  uVar12 = pResults->m_pbits[0] * 2;
  do {
    uVar16 = (uint)(pResults->m_low_endpoint).m_c[lVar19] << 2 | uVar12;
    uVar9 = (uint)(pResults->m_high_endpoint).m_c[lVar19] << 2 | uVar12;
    local_4c[lVar19] =
         (byte)((uVar16 >> 7 | uVar16) * 0x2e + (uVar9 >> 7 | uVar9) * 0x12 + 0x20 >> 6);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  if ((ulong)pParams->m_num_pixels == 0) {
    uVar8 = 0;
  }
  else {
    pcVar6 = pParams->m_pPixels;
    iVar13 = (uint)local_4c[2] + ((uint)local_4c[2] + (uint)local_4c[2] * 8) * 4 +
             (uint)local_4c[1] * 0x16e + (uint)local_4c[0] * 0x6d;
    uVar17 = 0;
    uVar8 = 0;
    do {
      uVar12 = (uint)pcVar6[uVar17].m_c[0];
      if (pParams->m_perceptual == '\0') {
        iVar14 = local_4c[0] - uVar12;
        iVar18 = (uint)local_4c[1] - (uint)pcVar6[uVar17].m_c[1];
        iVar10 = (uint)local_4c[2] - (uint)pcVar6[uVar17].m_c[2];
      }
      else {
        iVar10 = (uint)pcVar6[uVar17].m_c[2] * 0x25 +
                 (uint)pcVar6[uVar17].m_c[1] * 0x16e + uVar12 * 0x6d;
        iVar14 = iVar13 - iVar10 >> 8;
        iVar18 = (int)(((local_4c[0] - uVar12) * 0x200 - iVar13) + iVar10) >> 8;
        iVar10 = (int)(((uint)local_4c[2] * 0x200 - ((uint)pcVar6[uVar17].m_c[2] * 0x200 + iVar13))
                      + iVar10) >> 8;
      }
      uVar8 = uVar8 + (iVar10 * iVar10 * pParams->m_weights[2] +
                      iVar18 * iVar18 * pParams->m_weights[1] +
                      iVar14 * iVar14 * pParams->m_weights[0]);
      uVar17 = uVar17 + 1;
    } while (pParams->m_num_pixels != uVar17);
  }
  pResults->m_best_overall_err = uVar8;
  return uVar8;
}

Assistant:

static uint64_t pack_mode1_to_one_color(const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, uint32_t r, uint32_t g, uint32_t b, uint8_t *pSelectors)
{
	uint32_t best_err = UINT_MAX;
	uint32_t best_p = 0;

	for (uint32_t p = 0; p < 2; p++)
	{
		uint32_t err = g_bc7_mode_1_optimal_endpoints[r][p].m_error + g_bc7_mode_1_optimal_endpoints[g][p].m_error + g_bc7_mode_1_optimal_endpoints[b][p].m_error;
		if (err < best_err)
		{
			best_err = err;
			best_p = p;
			if (!best_err)
				break;
		}
	}

	const endpoint_err *pEr = &g_bc7_mode_1_optimal_endpoints[r][best_p];
	const endpoint_err *pEg = &g_bc7_mode_1_optimal_endpoints[g][best_p];
	const endpoint_err *pEb = &g_bc7_mode_1_optimal_endpoints[b][best_p];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, 0);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, 0);
	pResults->m_pbits[0] = best_p;
	pResults->m_pbits[1] = 0;

	memset(pSelectors, BC7ENC_MODE_1_OPTIMAL_INDEX, pParams->m_num_pixels);

	color_quad_u8 p;
	for (uint32_t i = 0; i < 3; i++)
	{
		uint32_t low = ((pResults->m_low_endpoint.m_c[i] << 1) | pResults->m_pbits[0]) << 1;
		low |= (low >> 7);

		uint32_t high = ((pResults->m_high_endpoint.m_c[i] << 1) | pResults->m_pbits[0]) << 1;
		high |= (high >> 7);

		p.m_c[i] = (uint8_t)((low * (64 - g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX]) + high * g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX] + 32) >> 6);
	}
	p.m_c[3] = 255;

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		total_err += compute_color_distance_rgb(&p, &pParams->m_pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}